

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

uint * cimg_library::cimg::_exception_mode(uint value,bool is_set)

{
  undefined7 in_register_00000031;
  
  mutex(0,1);
  if ((int)CONCAT71(in_register_00000031,is_set) != 0) {
    _exception_mode::mode = value;
  }
  mutex(0,0);
  return &_exception_mode::mode;
}

Assistant:

inline unsigned int& _exception_mode(const unsigned int value, const bool is_set) {
      static unsigned int mode = cimg_verbosity;
      cimg::mutex(0);
      if (is_set) mode = value;
      cimg::mutex(0,0);
      return mode;
    }